

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

int __thiscall
CVmObjBigNum::getp_remainder(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  char *ext2;
  CVmObjPageEntry *pCVar1;
  vm_datatype_t *pvVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  char *new_ext;
  char *new_rem_ext;
  vm_val_t *pvVar5;
  vm_val_t val2;
  vm_val_t quo_val;
  vm_val_t rem_val;
  
  if (getp_remainder(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar3 = __cxa_guard_acquire(&getp_remainder(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar3 != 0) {
      getp_remainder::desc.min_argc_ = 1;
      getp_remainder::desc.opt_argc_ = 0;
      getp_remainder::desc.varargs_ = 0;
      __cxa_guard_release(&getp_remainder(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  pvVar5 = retval;
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_remainder::desc);
  if (iVar3 == 0) {
    val2.typ = sp_[-1].typ;
    val2._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
    val2.val = sp_[-1].val;
    sp_ = sp_ + -1;
    iVar3 = cvt_to_bignum((CVmObjBigNum *)pvVar5,self,&val2);
    pvVar5 = sp_;
    if (iVar3 == 0) {
      err_throw(0x900);
    }
    ext2 = *(char **)((long)&G_obj_table_X.pages_[val2.val.obj >> 0xc][val2.val.obj & 0xfff].ptr_ +
                     8);
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_OBJ;
    (pvVar5->val).obj = self;
    pvVar5 = sp_;
    sp_ = sp_ + 1;
    pvVar5->typ = val2.typ;
    *(undefined4 *)&pvVar5->field_0x4 = val2._4_4_;
    pvVar5->val = val2.val;
    new_ext = compute_init_2op(&quo_val,(this->super_CVmObject).ext_,ext2);
    pvVar5 = sp_;
    sp_ = sp_ + 1;
    pvVar5->typ = quo_val.typ;
    *(undefined4 *)&pvVar5->field_0x4 = quo_val._4_4_;
    pvVar5->val = quo_val.val;
    new_rem_ext = compute_init_2op(&rem_val,(this->super_CVmObject).ext_,ext2);
    pvVar5 = sp_;
    sp_ = sp_ + 1;
    pvVar5->typ = rem_val.typ;
    *(undefined4 *)&pvVar5->field_0x4 = rem_val._4_4_;
    pvVar5->val = rem_val.val;
    vVar4 = CVmObjList::create(0,2);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar4;
    pCVar1 = G_obj_table_X.pages_[vVar4 >> 0xc];
    CVmObjList::cons_set_element((CVmObjList *)(pCVar1 + (vVar4 & 0xfff)),0,&quo_val);
    CVmObjList::cons_set_element((CVmObjList *)(pCVar1 + (vVar4 & 0xfff)),1,&rem_val);
    compute_quotient_into(new_ext,new_rem_ext,(this->super_CVmObject).ext_,ext2);
    sp_ = sp_ + -4;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_remainder(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *argc)
{
    vm_val_t val2;
    const char *ext2;
    char *quo_ext;
    char *rem_ext;
    vm_val_t rem_val;
    vm_val_t quo_val;
    CVmObjList *lst;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the divisor */
    G_stk->pop(&val2);

    /* convert it to BigNumber */
    if (!cvt_to_bignum(vmg_ self, &val2))
    {
        /* it's not a BigNumber - throw an error */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* get the divisor's extension */
    ext2 = get_objid_ext(vmg_ val2.val.obj);

    /* push 'self' and the other value to protect against GC */
    G_stk->push()->set_obj(self);
    G_stk->push(&val2);

    /* create a quotient result value, and push it for safekeeping */
    quo_ext = compute_init_2op(vmg_ &quo_val, ext_, ext2);
    G_stk->push(&quo_val);

    /* create a remainder result value, and push it for safekeeping */
    rem_ext = compute_init_2op(vmg_ &rem_val, ext_, ext2);
    G_stk->push(&rem_val);

    /* 
     *   create a list for the return value - it will have two elements:
     *   the quotient and the remainder 
     */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, 2));
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* set the list elements */
    lst->cons_set_element(0, &quo_val);
    lst->cons_set_element(1, &rem_val);

    /* calculate the quotient */
    compute_quotient_into(quo_ext, rem_ext, ext_, ext2);

    /* remove the GC protection */
    G_stk->discard(4);

    /* handled */
    return TRUE;
}